

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_DerefOp_Test::TestBody(StatePointer_DerefOp_Test *this)

{
  bool bVar1;
  reference_type piVar2;
  reference_type piVar3;
  char *pcVar4;
  type local_68 [2];
  int foo1;
  int foo2;
  state_ptr<int,_unsigned_long,_2UL> p1a;
  state_ptr<int,_unsigned_long,_2UL> p1b;
  state_ptr<int,_unsigned_long,_2UL> p2;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  
  local_68[0] = 0x2a;
  local_68[1] = 0x539;
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<int,_unsigned_long,_2UL> *)&foo1,local_68,1);
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr(&p1a,local_68,1);
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr(&p1b,local_68 + 1,1);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*
                     ((state_ptr<int,_unsigned_long,_2UL> *)&foo1);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1a);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)&p2,"*p1a","*p1b",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p2);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)&p2);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p2);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*
                     ((state_ptr<int,_unsigned_long,_2UL> *)&foo1);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1b);
  testing::internal::CmpHelperNE<int,int>((internal *)&p2,"*p1a","*p2",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p2);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)&p2);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p2);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1a);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1b);
  testing::internal::CmpHelperNE<int,int>((internal *)&p2,"*p1b","*p2",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p2);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)&p2);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p2);
  return;
}

Assistant:

TEST(StatePointer, DerefOp) {
	int foo1{42};
	int foo2{1337};
	state_ptr<int> p1a{&foo1, 1};
	state_ptr<int> p1b{&foo1, 1};
	state_ptr<int> p2 {&foo2, 1};
	EXPECT_EQ(*p1a, *p1b);
	EXPECT_NE(*p1a, *p2);
	EXPECT_NE(*p1b, *p2);
}